

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialFDS.cpp
# Opt level: O3

PolynomialFDS * readPDS(string *filename)

{
  char cVar1;
  PolynomialFDS *pPVar2;
  runtime_error *this;
  ifstream ifil;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  istream local_220 [520];
  
  std::ifstream::ifstream(local_220,(string *)filename,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    pPVar2 = readPDS(local_220);
    std::ifstream::~ifstream(local_220);
    return pPVar2;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_240,"failed to open file: ",filename);
  std::runtime_error::runtime_error(this,(string *)&local_240);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

PolynomialFDS* readPDS(const std::string filename) {

  // Step1: read in the file as a list of lines.
  std::ifstream ifil(filename);
  if (not ifil.is_open())
    throw std::runtime_error("failed to open file: " + filename);

  return readPDS(ifil); // RAII closes file
}